

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cpp
# Opt level: O1

int __thiscall ncnn::MVN::forward(MVN *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int _w;
  int _h;
  uint _c;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  void *pvVar7;
  uint uVar8;
  ulong uVar9;
  void *pvVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  float fVar15;
  Mat local_d8;
  Mat local_88;
  size_t local_38;
  
  _w = bottom_blob->w;
  _h = bottom_blob->h;
  _c = bottom_blob->c;
  uVar13 = (ulong)_c;
  sVar2 = bottom_blob->elemsize;
  Mat::create(top_blob,_w,_h,_c,sVar2,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  local_d8.cstep = 0;
  local_d8.data = (void *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8._20_8_ = 0;
  local_d8.allocator = (Allocator *)0x0;
  local_d8.dims = 0;
  local_d8.w = 0;
  local_d8.h = 0;
  local_d8.d = 0;
  local_d8.c = 0;
  local_38 = sVar2;
  Mat::create(&local_d8,_c,sVar2,opt->workspace_allocator);
  iVar12 = -100;
  if ((local_d8.data != (void *)0x0) && ((long)local_d8.c * local_d8.cstep != 0)) {
    uVar8 = _h * _w;
    uVar14 = (ulong)uVar8;
    if (0 < (int)_c) {
      pvVar7 = bottom_blob->data;
      sVar2 = bottom_blob->cstep;
      sVar3 = bottom_blob->elemsize;
      uVar9 = 0;
      do {
        fVar15 = 0.0;
        if (0 < (int)uVar8) {
          uVar11 = 0;
          do {
            fVar15 = fVar15 + *(float *)((long)pvVar7 + uVar11 * 4);
            uVar11 = uVar11 + 1;
          } while (uVar14 != uVar11);
        }
        *(float *)((long)local_d8.data + uVar9 * 4) = fVar15;
        uVar9 = uVar9 + 1;
        pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
      } while (uVar9 != uVar13);
    }
    if (this->across_channels == 0) {
      if (0 < (int)_c) {
        pvVar7 = bottom_blob->data;
        sVar2 = bottom_blob->cstep;
        pvVar10 = top_blob->data;
        sVar3 = top_blob->cstep;
        sVar4 = top_blob->elemsize;
        sVar5 = bottom_blob->elemsize;
        uVar9 = 0;
        do {
          if (0 < (int)uVar8) {
            fVar15 = *(float *)((long)local_d8.data + uVar9 * 4);
            uVar11 = 0;
            do {
              *(float *)((long)pvVar10 + uVar11 * 4) =
                   *(float *)((long)pvVar7 + uVar11 * 4) - fVar15 * (1.0 / (float)(int)uVar8);
              uVar11 = uVar11 + 1;
            } while (uVar14 != uVar11);
          }
          uVar9 = uVar9 + 1;
          pvVar10 = (void *)((long)pvVar10 + sVar3 * sVar4);
          pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar5);
        } while (uVar9 != uVar13);
      }
    }
    else {
      fVar15 = 0.0;
      if (0 < (int)_c) {
        uVar9 = 0;
        do {
          fVar15 = fVar15 + *(float *)((long)local_d8.data + uVar9 * 4);
          uVar9 = uVar9 + 1;
        } while (uVar13 != uVar9);
      }
      if (0 < (int)_c) {
        pvVar7 = bottom_blob->data;
        sVar2 = bottom_blob->cstep;
        sVar3 = top_blob->cstep;
        sVar4 = top_blob->elemsize;
        pvVar10 = top_blob->data;
        sVar5 = bottom_blob->elemsize;
        uVar9 = 0;
        do {
          if (0 < (int)uVar8) {
            uVar11 = 0;
            do {
              *(float *)((long)pvVar10 + uVar11 * 4) =
                   *(float *)((long)pvVar7 + uVar11 * 4) - fVar15 / (float)(int)(_c * uVar8);
              uVar11 = uVar11 + 1;
            } while (uVar14 != uVar11);
          }
          uVar9 = uVar9 + 1;
          pvVar10 = (void *)((long)pvVar10 + sVar3 * sVar4);
          pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar5);
        } while (uVar9 != uVar13);
      }
    }
    if (this->normalize_variance != 0) {
      local_88.cstep = 0;
      local_88.data = (void *)0x0;
      local_88.refcount._0_4_ = 0;
      local_88.refcount._4_4_ = 0;
      local_88.elemsize._0_4_ = 0;
      local_88._20_8_ = 0;
      local_88.allocator = (Allocator *)0x0;
      local_88.dims = 0;
      local_88.w = 0;
      local_88.h = 0;
      local_88.d = 0;
      local_88.c = 0;
      Mat::create(&local_88,_c,local_38,opt->workspace_allocator);
      if (local_88.data == (void *)0x0 || (long)local_88.c * local_88.cstep == 0) {
        piVar6 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_88.allocator == (Allocator *)0x0) {
              if (local_88.data != (void *)0x0) {
                free(local_88.data);
              }
            }
            else {
              (*(local_88.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar12 = -100;
        local_88.cstep = 0;
        local_88.data = (void *)0x0;
        local_88.refcount._0_4_ = 0;
        local_88.refcount._4_4_ = 0;
        local_88.elemsize._0_4_ = 0;
        local_88._20_8_ = 0;
        local_88.dims = 0;
        local_88.w = 0;
        local_88.h = 0;
        local_88.d = 0;
        local_88.c = 0;
        goto LAB_0033337c;
      }
      if (0 < (int)_c) {
        pvVar7 = top_blob->data;
        sVar2 = top_blob->cstep;
        sVar3 = top_blob->elemsize;
        uVar9 = 0;
        do {
          fVar15 = 0.0;
          if (0 < (int)uVar8) {
            uVar11 = 0;
            do {
              fVar1 = *(float *)((long)pvVar7 + uVar11 * 4);
              fVar15 = fVar15 + fVar1 * fVar1;
              uVar11 = uVar11 + 1;
            } while (uVar14 != uVar11);
          }
          *(float *)((long)local_88.data + uVar9 * 4) = fVar15;
          uVar9 = uVar9 + 1;
          pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
        } while (uVar9 != uVar13);
      }
      if (this->across_channels == 0) {
        if (0 < (int)_c) {
          pvVar7 = top_blob->data;
          sVar2 = top_blob->cstep;
          sVar3 = top_blob->elemsize;
          uVar9 = 0;
          do {
            if (0 < (int)uVar8) {
              fVar15 = *(float *)((long)local_88.data + uVar9 * 4);
              fVar1 = this->eps;
              uVar11 = 0;
              do {
                *(float *)((long)pvVar7 + uVar11 * 4) =
                     *(float *)((long)pvVar7 + uVar11 * 4) *
                     (1.0 / (SQRT(fVar15 * (1.0 / (float)(int)uVar8)) + fVar1));
                uVar11 = uVar11 + 1;
              } while (uVar14 != uVar11);
            }
            uVar9 = uVar9 + 1;
            pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
          } while (uVar9 != uVar13);
        }
      }
      else {
        if ((int)_c < 1) {
          fVar15 = 0.0;
        }
        else {
          fVar15 = 0.0;
          uVar9 = 0;
          do {
            fVar15 = fVar15 + *(float *)((long)local_88.data + uVar9 * 4);
            uVar9 = uVar9 + 1;
          } while (uVar13 != uVar9);
        }
        if (0 < (int)_c) {
          fVar1 = this->eps;
          sVar2 = top_blob->cstep;
          sVar3 = top_blob->elemsize;
          pvVar7 = top_blob->data;
          uVar9 = 0;
          do {
            if (0 < (int)uVar8) {
              uVar11 = 0;
              do {
                *(float *)((long)pvVar7 + uVar11 * 4) =
                     *(float *)((long)pvVar7 + uVar11 * 4) *
                     (1.0 / (SQRT(fVar15 / (float)(int)(_c * uVar8)) + fVar1));
                uVar11 = uVar11 + 1;
              } while (uVar14 != uVar11);
            }
            uVar9 = uVar9 + 1;
            pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
          } while (uVar9 != uVar13);
        }
      }
      piVar6 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_88.allocator == (Allocator *)0x0) {
            if (local_88.data != (void *)0x0) {
              free(local_88.data);
            }
          }
          else {
            (*(local_88.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_88.cstep = 0;
      local_88.data = (void *)0x0;
      local_88.refcount._0_4_ = 0;
      local_88.refcount._4_4_ = 0;
      local_88.elemsize._0_4_ = 0;
      local_88._20_8_ = 0;
      local_88.dims = 0;
      local_88.w = 0;
      local_88.h = 0;
      local_88.d = 0;
      local_88.c = 0;
    }
    iVar12 = 0;
  }
LAB_0033337c:
  piVar6 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        if (local_d8.data != (void *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar12;
}

Assistant:

int MVN::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // prepare sum per channel
    Mat sum(channels, elemsize, opt.workspace_allocator);
    if (sum.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);

        float s = 0.f;
        for (int i = 0; i < size; i++)
        {
            s += ptr[i];
        }

        sum[q] = s;
    }

    if (across_channels)
    {
        // compute mean across channels
        float mean = 0.f;
        for (int q = 0; q < channels; q++)
        {
            mean += sum[q];
        }
        mean = mean / (channels * size);

        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }
    else
    {
        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            float mean = sum[q] / size;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }

    if (normalize_variance)
    {
        // prepare squared sum per channel
        Mat sqsum(channels, elemsize, opt.workspace_allocator);
        if (sqsum.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = top_blob.channel(q);

            float s = 0.f;
            for (int i = 0; i < size; i++)
            {
                s += ptr[i] * ptr[i];
            }

            sqsum[q] = s;
        }

        if (across_channels)
        {
            // compute squared mean across channels
            float sqmean = 0.f;
            for (int q = 0; q < channels; q++)
            {
                sqmean += sqsum[q];
            }
            sqmean = sqmean / (channels * size);

            // normalize variance
            float norm_var = sqrtf(sqmean) + eps;
            float norm_var_inv = 1.f / norm_var;

            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }
        else
        {
            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* outptr = top_blob.channel(q);
                float sqmean = sqsum[q] / size;
                float norm_var = sqrt(sqmean) + eps;
                float norm_var_inv = 1.f / norm_var;

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }
    }

    return 0;
}